

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

fxp_xfer * xfer_download_init(fxp_handle *fh,uint64_t offset)

{
  fxp_xfer *xfer;
  
  xfer = (fxp_xfer *)safemalloc(1,0x40,0);
  xfer->fh = fh;
  xfer->offset = offset;
  xfer->req_totalsize = 0;
  xfer->req_maxsize = 0x100000;
  xfer->head = (req *)0x0;
  xfer->tail = (req *)0x0;
  xfer->filesize = 0xffffffffffffffff;
  xfer->furthestdata = 0;
  xfer->eof = false;
  xfer->err = false;
  xfer_download_queue(xfer);
  return xfer;
}

Assistant:

struct fxp_xfer *xfer_download_init(struct fxp_handle *fh, uint64_t offset)
{
    struct fxp_xfer *xfer = xfer_init(fh, offset);

    xfer->eof = false;
    xfer_download_queue(xfer);

    return xfer;
}